

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::HostFunc::DoCall
          (HostFunc *this,Thread *thread,Values *params,Values *results,Ptr *out_trap)

{
  Result RVar1;
  Ptr *local_8;
  
  local_8 = out_trap;
  if ((this->callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
    RVar1 = (*(this->callback_)._M_invoker)((_Any_data *)&this->callback_,params,results,&local_8);
    return (Result)RVar1.enum_;
  }
  std::__throw_bad_function_call();
}

Assistant:

Result HostFunc::DoCall(Thread& thread,
                        const Values& params,
                        Values& results,
                        Trap::Ptr* out_trap) {
  return callback_(params, results, out_trap);
}